

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void * malloc_default(size_t size)

{
  cache_bin_stats_t *pcVar1;
  tcache_t *tcache;
  int iVar2;
  size_t sVar3;
  long lVar4;
  _Bool _Var5;
  szind_t sVar6;
  tsd_t *tsd;
  arena_t *paVar7;
  void *pvVar8;
  int *piVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  cache_bin_t *pcVar13;
  char *in_FS_OFFSET;
  uintptr_t args [3];
  
  tsd = *(tsd_t **)in_FS_OFFSET;
  if ((*in_FS_OFFSET != '\0') && (tsd = tsd_fetch_slow(tsd,false), (tsd->state).repr != '\0')) {
    if ((malloc_init_state != malloc_init_initialized) && (_Var5 = malloc_init_hard(), _Var5))
    goto LAB_001275bc;
    if (size < 0x1001) {
      sVar6 = (szind_t)sz_size2index_tab[size + 7 >> 3];
    }
    else {
      sVar6 = sz_size2index_compute(size);
    }
    if (0xe7 < sVar6) goto LAB_001277b8;
    sVar3 = sz_index2size_tab[sVar6];
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == false) {
LAB_001274c5:
        paVar7 = (arena_t *)0x0;
        goto LAB_001274c7;
      }
      tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
      if (size < 0x3801) {
        pcVar13 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small +
                  sVar6;
        iVar2 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                [sVar6].ncached;
        iVar12 = iVar2 + -1;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar6].
        ncached = iVar12;
        if (((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar6].
             low_water < iVar12) || (pcVar13->low_water = iVar12, iVar2 != 0)) {
          pvVar8 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                   [sVar6].avail[-iVar2];
        }
        else {
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar6].
          ncached = 0;
          paVar7 = arena_choose(tsd,(arena_t *)0x0);
          if ((paVar7 == (arena_t *)0x0) ||
             (pvVar8 = tcache_alloc_small_hard
                                 ((tsdn_t *)tsd,paVar7,tcache,pcVar13,sVar6,(_Bool *)args),
             (char)args[0] == '\0')) goto LAB_001277b8;
        }
        if (opt_junk_alloc == true) {
          arena_alloc_junk_small(pvVar8,bin_infos + sVar6,false);
        }
        else if (opt_zero == true) {
          memset(pvVar8,0,sz_index2size_tab[sVar6]);
        }
        pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                  [sVar6].tstats;
        pcVar1->nrequests = pcVar1->nrequests + 1;
        iVar12 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick =
             iVar12 + -1;
        if (iVar12 < 1) {
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick =
               (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.nticks;
          tcache_event_hard(tsd,tcache);
        }
        goto LAB_001274dd;
      }
      if (tcache_maxclass < size) goto LAB_001274c5;
      iVar2 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
              [(ulong)sVar6 + 5].ncached;
      iVar12 = iVar2 + -1;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
      [(ulong)sVar6 + 5].ncached = iVar12;
      if (((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
           [(ulong)sVar6 + 5].low_water < iVar12) ||
         ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
          [(ulong)sVar6 + 5].low_water = iVar12, iVar2 != 0)) {
        pvVar8 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                 [(ulong)sVar6 + 5].avail[-iVar2];
        if (opt_junk_alloc == true) {
          iVar12 = 0xa5;
LAB_001277da:
          memset(pvVar8,iVar12,sz_index2size_tab[sVar6]);
        }
        else if (opt_zero == true) {
          iVar12 = 0;
          goto LAB_001277da;
        }
        pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                  [(ulong)sVar6 + 5].tstats;
        pcVar1->nrequests = pcVar1->nrequests + 1;
LAB_0012765f:
        iVar12 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick;
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick =
             iVar12 + -1;
        if (iVar12 < 1) {
          (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick =
               (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.nticks;
          tcache_event_hard(tsd,tcache);
        }
        goto LAB_001274dd;
      }
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
      [(ulong)sVar6 + 5].ncached = 0;
      paVar7 = arena_choose(tsd,(arena_t *)0x0);
      if (paVar7 != (arena_t *)0x0) {
        if (size < 0x7000000000000001) {
          uVar11 = size * 2 - 1;
          lVar4 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          uVar11 = 0xf;
          if (6 < (uint)lVar4) {
            uVar11 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
          }
          sVar10 = ~uVar11 & uVar11 + size;
        }
        else {
          sVar10 = 0;
        }
        pvVar8 = large_malloc((tsdn_t *)tsd,paVar7,sVar10,false);
        if (pvVar8 != (void *)0x0) goto LAB_0012765f;
      }
    }
    else {
      paVar7 = arena_get((tsdn_t *)tsd,0,true);
LAB_001274c7:
      pvVar8 = arena_malloc_hard((tsdn_t *)tsd,paVar7,size,sVar6,false);
LAB_001274dd:
      if (pvVar8 != (void *)0x0) {
        tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated =
             tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated + sVar3;
        goto LAB_001274ea;
      }
    }
LAB_001277b8:
    piVar9 = __errno_location();
    *piVar9 = 0xc;
    pvVar8 = (void *)0x0;
LAB_001274ea:
    args[1] = 0;
    args[2] = 0;
    args[0] = size;
    hook_invoke_alloc(hook_alloc_malloc,pvVar8,(uintptr_t)pvVar8,args);
    return pvVar8;
  }
  if (size < 0x1001) {
    sVar6 = (szind_t)sz_size2index_tab[size + 7 >> 3];
  }
  else {
    sVar6 = sz_size2index_compute(size);
  }
  if (0xe7 < sVar6) goto LAB_001275bc;
  sVar3 = sz_index2size_tab[sVar6];
  if (size < 0x3801) {
    pcVar13 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small + sVar6
    ;
    iVar2 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar6].
            ncached;
    iVar12 = iVar2 + -1;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar6].ncached =
         iVar12;
    if ((pcVar13->low_water < iVar12) || (pcVar13->low_water = iVar12, iVar2 != 0)) {
      pvVar8 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar6]
               .avail[-iVar2];
    }
    else {
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar6].ncached
           = 0;
      paVar7 = arena_choose(tsd,(arena_t *)0x0);
      if ((paVar7 == (arena_t *)0x0) ||
         (pvVar8 = tcache_alloc_small_hard
                             ((tsdn_t *)tsd,paVar7,
                              &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,
                              pcVar13,sVar6,(_Bool *)args), (char)args[0] == '\0'))
      goto LAB_001275bc;
    }
    pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small[sVar6].
              tstats;
    pcVar1->nrequests = pcVar1->nrequests + 1;
LAB_001272b1:
    iVar12 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick;
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick = iVar12 + -1
    ;
    if (iVar12 < 1) {
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.tick =
           (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).gc_ticker.nticks;
      tcache_event_hard(tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache);
    }
  }
  else {
    if (size <= tcache_maxclass) {
      pcVar13 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small +
                (ulong)sVar6 + 5;
      iVar2 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
              [(ulong)sVar6 + 5].ncached;
      iVar12 = iVar2 + -1;
      (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
      [(ulong)sVar6 + 5].ncached = iVar12;
      if ((pcVar13->low_water < iVar12) || (pcVar13->low_water = iVar12, iVar2 != 0)) {
        pvVar8 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                 [(ulong)sVar6 + 5].avail[-iVar2];
        pcVar1 = &(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
                  [(ulong)sVar6 + 5].tstats;
        pcVar1->nrequests = pcVar1->nrequests + 1;
      }
      else {
        (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins_small
        [(ulong)sVar6 + 5].ncached = 0;
        paVar7 = arena_choose(tsd,(arena_t *)0x0);
        if (paVar7 == (arena_t *)0x0) goto LAB_001275bc;
        if (size < 0x7000000000000001) {
          uVar11 = size * 2 - 1;
          lVar4 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          uVar11 = 0xf;
          if (6 < (uint)lVar4) {
            uVar11 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
          }
          sVar10 = ~uVar11 & size + uVar11;
        }
        else {
          sVar10 = 0;
        }
        pvVar8 = large_malloc((tsdn_t *)tsd,paVar7,sVar10,false);
        if (pvVar8 == (void *)0x0) goto LAB_001275bc;
      }
      goto LAB_001272b1;
    }
    pvVar8 = arena_malloc_hard((tsdn_t *)tsd,(arena_t *)0x0,size,sVar6,false);
  }
  if (pvVar8 != (void *)0x0) {
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated =
         tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated + sVar3;
    return pvVar8;
  }
LAB_001275bc:
  piVar9 = __errno_location();
  *piVar9 = 0xc;
  return (void *)0x0;
}

Assistant:

JEMALLOC_NOINLINE
void *
malloc_default(size_t size) {
	void *ret;
	static_opts_t sopts;
	dynamic_opts_t dopts;

	LOG("core.malloc.entry", "size: %zu", size);

	static_opts_init(&sopts);
	dynamic_opts_init(&dopts);

	sopts.null_out_result_on_error = true;
	sopts.set_errno_on_error = true;
	sopts.oom_string = "<jemalloc>: Error in malloc(): out of memory\n";

	dopts.result = &ret;
	dopts.num_items = 1;
	dopts.item_size = size;

	imalloc(&sopts, &dopts);
	/*
	 * Note that this branch gets optimized away -- it immediately follows
	 * the check on tsd_fast that sets sopts.slow.
	 */
	if (sopts.slow) {
		uintptr_t args[3] = {size};
		hook_invoke_alloc(hook_alloc_malloc, ret, (uintptr_t)ret, args);
	}

	LOG("core.malloc.exit", "result: %p", ret);

	return ret;
}